

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  int iVar1;
  xmlElementContentPtr pxVar2;
  xmlElementContentPtr pxVar3;
  xmlChar *pxVar4;
  bool bVar5;
  bool bVar6;
  int found;
  int inputid_1;
  int inputid;
  xmlChar type;
  xmlChar *elem;
  xmlElementContentPtr op;
  xmlElementContentPtr last;
  xmlElementContentPtr cur;
  xmlElementContentPtr ret;
  int depth_local;
  int inputchk_local;
  xmlParserCtxtPtr ctxt_local;
  
  op = (xmlElementContentPtr)0x0;
  inputid_1._3_1_ = 0;
  if (((0x80 < depth) && ((ctxt->options & 0x80000U) == 0)) || (0x800 < depth)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankChars(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar1 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar1,depth + 1);
    if (cur == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  }
  else {
    pxVar4 = xmlParseName(ctxt);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    cur = xmlNewDocElementContent(ctxt->myDoc,pxVar4,XML_ELEMENT_CONTENT_ELEMENT);
    if (cur == (xmlElementContentPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (*ctxt->input->cur == '?') {
      cur->ocur = XML_ELEMENT_CONTENT_OPT;
      xmlNextChar(ctxt);
    }
    else if (*ctxt->input->cur == '*') {
      cur->ocur = XML_ELEMENT_CONTENT_MULT;
      xmlNextChar(ctxt);
    }
    else if (*ctxt->input->cur == '+') {
      cur->ocur = XML_ELEMENT_CONTENT_PLUS;
      xmlNextChar(ctxt);
    }
    else {
      cur->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  }
  xmlSkipBlankChars(ctxt);
  last = cur;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  do {
    bVar5 = false;
    if (*ctxt->input->cur != ')') {
      bVar5 = ctxt->instate != XML_PARSER_EOF;
    }
    if (!bVar5) {
      if (((last != (xmlElementContentPtr)0x0) && (op != (xmlElementContentPtr)0x0)) &&
         (last->c2 = op, op != (xmlElementContentPtr)0x0)) {
        op->parent = last;
      }
      if (ctxt->input->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '?') {
        if (cur != (xmlElementContentPtr)0x0) {
          if ((cur->ocur == XML_ELEMENT_CONTENT_PLUS) || (cur->ocur == XML_ELEMENT_CONTENT_MULT)) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
          else {
            cur->ocur = XML_ELEMENT_CONTENT_OPT;
          }
        }
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '*') {
        if (cur != (xmlElementContentPtr)0x0) {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
          last = cur;
          while( true ) {
            bVar5 = false;
            if (last != (xmlElementContentPtr)0x0) {
              bVar5 = last->type == XML_ELEMENT_CONTENT_OR;
            }
            if (!bVar5) break;
            if ((last->c1 != (_xmlElementContent *)0x0) &&
               ((last->c1->ocur == XML_ELEMENT_CONTENT_OPT ||
                (last->c1->ocur == XML_ELEMENT_CONTENT_MULT)))) {
              last->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
            if ((last->c2 != (_xmlElementContent *)0x0) &&
               ((last->c2->ocur == XML_ELEMENT_CONTENT_OPT ||
                (last->c2->ocur == XML_ELEMENT_CONTENT_MULT)))) {
              last->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
            last = last->c2;
          }
        }
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '+') {
        if (cur != (xmlElementContentPtr)0x0) {
          bVar5 = false;
          if ((cur->ocur == XML_ELEMENT_CONTENT_OPT) || (cur->ocur == XML_ELEMENT_CONTENT_MULT)) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
          else {
            cur->ocur = XML_ELEMENT_CONTENT_PLUS;
          }
          while( true ) {
            bVar6 = false;
            if (last != (xmlElementContentPtr)0x0) {
              bVar6 = last->type == XML_ELEMENT_CONTENT_OR;
            }
            if (!bVar6) break;
            if ((last->c1 != (_xmlElementContent *)0x0) &&
               ((last->c1->ocur == XML_ELEMENT_CONTENT_OPT ||
                (last->c1->ocur == XML_ELEMENT_CONTENT_MULT)))) {
              last->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar5 = true;
            }
            if ((last->c2 != (_xmlElementContent *)0x0) &&
               ((last->c2->ocur == XML_ELEMENT_CONTENT_OPT ||
                (last->c2->ocur == XML_ELEMENT_CONTENT_MULT)))) {
              last->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar5 = true;
            }
            last = last->c2;
          }
          if (bVar5) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
        }
        xmlNextChar(ctxt);
      }
      return cur;
    }
    pxVar2 = cur;
    if (*ctxt->input->cur == ',') {
      if (inputid_1._3_1_ == 0) {
        inputid_1._3_1_ = *ctxt->input->cur;
      }
      else if (inputid_1._3_1_ != *ctxt->input->cur) {
        xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                          "xmlParseElementChildrenContentDecl : \'%c\' expected\n",
                          (uint)inputid_1._3_1_);
        if ((op != (xmlElementContentPtr)0x0) && (op != cur)) {
          xmlFreeDocElementContent(ctxt->myDoc,op);
        }
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      xmlNextChar(ctxt);
      pxVar3 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
      if (pxVar3 == (xmlElementContentPtr)0x0) {
        if ((op != (xmlElementContentPtr)0x0) && (op != cur)) {
          xmlFreeDocElementContent(ctxt->myDoc,op);
        }
        xmlFreeDocElementContent(ctxt->myDoc,cur);
        return (xmlElementContentPtr)0x0;
      }
      if (op == (xmlElementContentPtr)0x0) {
        pxVar3->c1 = cur;
        last = pxVar3;
        pxVar2 = pxVar3;
        if (cur != (xmlElementContentPtr)0x0) {
          cur->parent = pxVar3;
        }
      }
      else {
        last->c2 = pxVar3;
        if (pxVar3 != (xmlElementContentPtr)0x0) {
          pxVar3->parent = last;
        }
        pxVar3->c1 = op;
        last = pxVar3;
        if (op != (xmlElementContentPtr)0x0) {
          op->parent = pxVar3;
        }
      }
    }
    else {
      if (*ctxt->input->cur != '|') {
        xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
        if ((op != (xmlElementContentPtr)0x0) && (op != cur)) {
          xmlFreeDocElementContent(ctxt->myDoc,op);
        }
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      if (inputid_1._3_1_ == 0) {
        inputid_1._3_1_ = *ctxt->input->cur;
      }
      else if (inputid_1._3_1_ != *ctxt->input->cur) {
        xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                          "xmlParseElementChildrenContentDecl : \'%c\' expected\n",
                          (uint)inputid_1._3_1_);
        if ((op != (xmlElementContentPtr)0x0) && (op != cur)) {
          xmlFreeDocElementContent(ctxt->myDoc,op);
        }
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      xmlNextChar(ctxt);
      pxVar3 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
      if (pxVar3 == (xmlElementContentPtr)0x0) {
        if ((op != (xmlElementContentPtr)0x0) && (op != cur)) {
          xmlFreeDocElementContent(ctxt->myDoc,op);
        }
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      if (op == (xmlElementContentPtr)0x0) {
        pxVar3->c1 = cur;
        last = pxVar3;
        pxVar2 = pxVar3;
        if (cur != (xmlElementContentPtr)0x0) {
          cur->parent = pxVar3;
        }
      }
      else {
        last->c2 = pxVar3;
        if (pxVar3 != (xmlElementContentPtr)0x0) {
          pxVar3->parent = last;
        }
        pxVar3->c1 = op;
        last = pxVar3;
        if (op != (xmlElementContentPtr)0x0) {
          op->parent = pxVar3;
        }
      }
    }
    cur = pxVar2;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (*ctxt->input->cur == '(') {
      iVar1 = ctxt->input->id;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      op = xmlParseElementChildrenContentDeclPriv(ctxt,iVar1,depth + 1);
      if (op == (xmlElementContentPtr)0x0) {
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      xmlSkipBlankChars(ctxt);
    }
    else {
      pxVar4 = xmlParseName(ctxt);
      if (pxVar4 == (xmlChar *)0x0) {
        xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      op = xmlNewDocElementContent(ctxt->myDoc,pxVar4,XML_ELEMENT_CONTENT_ELEMENT);
      if (op == (xmlElementContentPtr)0x0) {
        if (cur != (xmlElementContentPtr)0x0) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        return (xmlElementContentPtr)0x0;
      }
      if (*ctxt->input->cur == '?') {
        op->ocur = XML_ELEMENT_CONTENT_OPT;
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '*') {
        op->ocur = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '+') {
        op->ocur = XML_ELEMENT_CONTENT_PLUS;
        xmlNextChar(ctxt);
      }
      else {
        op->ocur = XML_ELEMENT_CONTENT_ONCE;
      }
    }
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  } while( true );
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (((depth > 128) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (depth >  2048)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED,
"xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
                          depth);
	return(NULL);
    }
    SKIP_BLANKS;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS;
    SHRINK;
    while ((RAW != ')') && (ctxt->instate != XML_PARSER_EOF)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}